

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  bool bVar1;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  param_type *this_00;
  void *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  double b;
  double a;
  double sigma;
  double mu;
  delim_c *in_stack_ffffffffffffff58;
  basic_istream<char,_std::char_traits<char>_> *mu_00;
  undefined1 local_70 [55];
  char local_39;
  char local_38;
  char local_37;
  char local_36;
  char local_35;
  fmtflags local_34;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  void *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_34 = Catch::clara::std::ios_base::flags
                       ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  mu_00 = local_8;
  local_35 = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff58);
  this_00 = (param_type *)std::istream::operator>>((istream *)pbVar3,&local_18);
  local_36 = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff58);
  std::istream::operator>>((istream *)pbVar3,&local_20);
  local_37 = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff58);
  std::istream::operator>>((istream *)pbVar3,&local_28);
  local_38 = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(this,in_stack_ffffffffffffff58);
  std::istream::operator>>((istream *)pbVar3,&local_30);
  local_39 = (char)utility::delim('\0');
  utility::operator>>(this,in_stack_ffffffffffffff58);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    truncated_normal_dist<double>::param_type::param_type
              (this_00,(result_type_conflict2)mu_00,(result_type_conflict2)this,
               (result_type_conflict2)in_stack_ffffffffffffff58,1.68306327836567e-317);
    memcpy(local_10,local_70,0x30);
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),local_34);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t mu, sigma, a, b;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> mu >> utility::delim(' ') >> sigma >>
            utility::delim(' ') >> a >> utility::delim(' ') >> b >> utility::delim(')');
        if (in)
          P = param_type(mu, sigma, a, b);
        in.flags(flags);
        return in;
      }